

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxSelect(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *val,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *stab,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *bestDelta,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *max,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *update,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *lowBound,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *upBound,int start,int incr)

{
  Type TVar1;
  uint uVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pnVar4;
  int *piVar5;
  SPxId *pSVar6;
  long lVar7;
  int iVar8;
  pointer pnVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  uint *puVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  uint *puVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  pointer pnVar17;
  uint *puVar18;
  ulong uVar19;
  byte bVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  uint local_2b4;
  uint local_2b0;
  cpp_dec_float<200U,_int,_void> local_288;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_208;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_200;
  pointer local_1f8;
  cpp_dec_float<200U,_int,_void> *local_1f0;
  pointer local_1e8;
  undefined8 local_1e0;
  cpp_dec_float<200U,_int,_void> local_1d8;
  uint *local_158;
  pointer local_150;
  long local_148;
  uint *local_140;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar20 = 0;
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 0x1c;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_1e0 = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  TVar1 = (this->
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_type;
  if (TVar1 != LEAVE) {
    pSVar3 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_1e0 = CONCAT71((int7)((ulong)pSVar3 >> 8),pSVar3->theRep == ROW);
  }
  local_1e8 = (upBound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1f8 = (lowBound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pnVar4 = (update->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar17 = (update->thedelta).
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar8 = (update->thedelta).super_IdxSet.num;
  local_2b4 = 0xffffffff;
  local_2b0 = 0xffffffff;
  local_208 = bestDelta;
  local_200 = val;
  local_1f0 = &best->m_backend;
  if (start < iVar8) {
    piVar5 = (update->thedelta).super_IdxSet.idx;
    local_140 = (uint *)(piVar5 + iVar8);
    puVar18 = (uint *)(piVar5 + start);
    local_158 = (stab->m_backend).data._M_elems + 1;
    local_148 = (long)incr << 2;
    local_2b0 = 0xffffffff;
    local_2b4 = 0xffffffff;
    local_150 = pnVar17;
    do {
      uVar2 = *puVar18;
      pnVar9 = pnVar17 + (int)uVar2;
      pcVar12 = &local_b8;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar12->data)._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
        pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar20 * -2 + 1) * 4);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar20 * -8 + 4);
      }
      local_b8.exp = pnVar17[(int)uVar2].m_backend.exp;
      local_b8.neg = pnVar17[(int)uVar2].m_backend.neg;
      local_b8.fpclass = pnVar17[(int)uVar2].m_backend.fpclass;
      local_b8.prec_elem = pnVar17[(int)uVar2].m_backend.prec_elem;
      if (TVar1 == LEAVE) {
        if (this->iscoid == true) {
          pSVar3 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          iVar8 = pSVar3->theRep *
                  ((pSVar3->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thedesc.costat)->data[(int)uVar2];
        }
        else {
          pSVar3 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          iVar8 = pSVar3->theRep *
                  ((pSVar3->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thedesc.stat)->data[(int)uVar2];
        }
        if (iVar8 < 1) goto LAB_005ca1fc;
      }
      else {
LAB_005ca1fc:
        if ((char)local_1e0 != '\0') {
          pSVar3 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar6 = (pSVar3->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < pSVar6[(int)uVar2].super_DataKey.info) {
            SPxColId::SPxColId((SPxColId *)&local_288,pSVar6 + (int)uVar2);
            pnVar17 = local_150;
            iVar8 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                    ::number(&(pSVar3->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set,(DataKey *)&local_288);
            if ((pSVar3->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar8] == P_FIXED) goto LAB_005ca7b1;
          }
        }
        if (((local_b8.fpclass == cpp_dec_float_NaN) ||
            ((stab->m_backend).fpclass == cpp_dec_float_NaN)) ||
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_b8,&stab->m_backend), iVar8 < 1)) {
          pnVar10 = stab;
          pcVar12 = &local_288;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pcVar12->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
            pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar10 + ((ulong)bVar20 * -2 + 1) * 4);
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar12 + ((ulong)bVar20 * -2 + 1) * 4);
          }
          local_288.exp = (stab->m_backend).exp;
          local_288.neg = (stab->m_backend).neg;
          local_288.fpclass = (stab->m_backend).fpclass;
          local_288.prec_elem = (stab->m_backend).prec_elem;
          if (local_288.data._M_elems[0] != 0 || local_288.fpclass != cpp_dec_float_finite) {
            local_288.neg = (bool)(local_288.neg ^ 1);
          }
          if (((local_288.fpclass != cpp_dec_float_NaN) && (local_b8.fpclass != cpp_dec_float_NaN))
             && (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_b8,&local_288), iVar8 < 0)) {
            pcVar12 = &local_1f8[(int)uVar2].m_backend;
            local_1d8.fpclass = cpp_dec_float_finite;
            local_1d8.prec_elem = 0x1c;
            local_1d8.data._M_elems[0] = 0;
            local_1d8.data._M_elems[1] = 0;
            local_1d8.data._M_elems[2] = 0;
            local_1d8.data._M_elems[3] = 0;
            local_1d8.data._M_elems[4] = 0;
            local_1d8.data._M_elems[5] = 0;
            local_1d8.data._M_elems[6] = 0;
            local_1d8.data._M_elems[7] = 0;
            local_1d8.data._M_elems[8] = 0;
            local_1d8.data._M_elems[9] = 0;
            local_1d8.data._M_elems[10] = 0;
            local_1d8.data._M_elems[0xb] = 0;
            local_1d8.data._M_elems[0xc] = 0;
            local_1d8.data._M_elems[0xd] = 0;
            local_1d8.data._M_elems[0xe] = 0;
            local_1d8.data._M_elems[0xf] = 0;
            local_1d8.data._M_elems[0x10] = 0;
            local_1d8.data._M_elems[0x11] = 0;
            local_1d8.data._M_elems[0x12] = 0;
            local_1d8.data._M_elems[0x13] = 0;
            local_1d8.data._M_elems[0x14] = 0;
            local_1d8.data._M_elems[0x15] = 0;
            local_1d8.data._M_elems[0x16] = 0;
            local_1d8.data._M_elems[0x17] = 0;
            local_1d8.data._M_elems[0x18] = 0;
            local_1d8.data._M_elems[0x19] = 0;
            local_1d8.data._M_elems._104_5_ = 0;
            local_1d8.data._M_elems[0x1b]._1_3_ = 0;
            local_1d8.exp = 0;
            local_1d8.neg = false;
            if (&local_1d8 == &pnVar4[(int)uVar2].m_backend) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_1d8,pcVar12);
              if (local_1d8.data._M_elems[0] != 0 || local_1d8.fpclass != cpp_dec_float_finite) {
                local_1d8.neg = (bool)(local_1d8.neg ^ 1);
              }
            }
            else {
              if (&local_1d8 != pcVar12) {
                pcVar11 = pcVar12;
                pcVar14 = &local_1d8;
                for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
                  (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
                  pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar11 + (ulong)bVar20 * -8 + 4);
                  pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar14 + (ulong)bVar20 * -8 + 4);
                }
                local_1d8.exp = pcVar12->exp;
                local_1d8.neg = pcVar12->neg;
                local_1d8.fpclass = pcVar12->fpclass;
                local_1d8.prec_elem = pcVar12->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_1d8,&pnVar4[(int)uVar2].m_backend);
            }
            local_288.fpclass = cpp_dec_float_finite;
            local_288.prec_elem = 0x1c;
            local_288.data._M_elems[0] = 0;
            local_288.data._M_elems[1] = 0;
            local_288.data._M_elems[2] = 0;
            local_288.data._M_elems[3] = 0;
            local_288.data._M_elems[4] = 0;
            local_288.data._M_elems[5] = 0;
            local_288.data._M_elems[6] = 0;
            local_288.data._M_elems[7] = 0;
            local_288.data._M_elems[8] = 0;
            local_288.data._M_elems[9] = 0;
            local_288.data._M_elems[10] = 0;
            local_288.data._M_elems[0xb] = 0;
            local_288.data._M_elems[0xc] = 0;
            local_288.data._M_elems[0xd] = 0;
            local_288.data._M_elems[0xe] = 0;
            local_288.data._M_elems[0xf] = 0;
            local_288.data._M_elems[0x10] = 0;
            local_288.data._M_elems[0x11] = 0;
            local_288.data._M_elems[0x12] = 0;
            local_288.data._M_elems[0x13] = 0;
            local_288.data._M_elems[0x14] = 0;
            local_288.data._M_elems[0x15] = 0;
            local_288.data._M_elems[0x16] = 0;
            local_288.data._M_elems[0x17] = 0;
            local_288.data._M_elems[0x18] = 0;
            local_288.data._M_elems[0x19] = 0;
            local_288.data._M_elems._104_5_ = 0;
            local_288.data._M_elems[0x1b]._1_3_ = 0;
            local_288.exp = 0;
            local_288.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&local_288,&local_1d8,&local_b8);
            pcVar12 = &local_288;
            pcVar11 = &local_138;
            for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pcVar11->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar20 * -8 + 4);
              pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar20 * -8 + 4);
            }
            local_138.exp = local_288.exp;
            local_138.neg = local_288.neg;
            local_138.fpclass = local_288.fpclass;
            local_138.prec_elem = local_288.prec_elem;
            if (((local_288.fpclass == cpp_dec_float_NaN) ||
                ((max->m_backend).fpclass == cpp_dec_float_NaN)) ||
               (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&local_138,&max->m_backend), 0 < iVar8)) goto LAB_005ca6bb;
            pcVar12 = &local_138;
            pnVar10 = local_200;
            for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pnVar10->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar20 * -8 + 4);
              pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar10 + ((ulong)bVar20 * -2 + 1) * 4);
            }
            (local_200->m_backend).exp = local_138.exp;
            (local_200->m_backend).neg = local_138.neg;
            (local_200->m_backend).fpclass = local_138.fpclass;
            (local_200->m_backend).prec_elem = local_138.prec_elem;
            (stab->m_backend).data._M_elems[0] = local_b8.data._M_elems[0];
            puVar13 = local_b8.data._M_elems + 1;
            puVar15 = local_158;
            for (lVar7 = 0x1b; lVar7 != 0; lVar7 = lVar7 + -1) {
              *puVar15 = *puVar13;
              puVar13 = puVar13 + (ulong)bVar20 * -2 + 1;
              puVar15 = puVar15 + (ulong)bVar20 * -2 + 1;
            }
            (stab->m_backend).exp = local_b8.exp;
            (stab->m_backend).neg =
                 (bool)((local_b8.data._M_elems[0] != 0 || local_b8.fpclass != cpp_dec_float_finite)
                       ^ local_b8.neg);
            (stab->m_backend).fpclass = local_b8.fpclass;
            (stab->m_backend).prec_elem = local_b8.prec_elem;
            local_2b4 = uVar2;
          }
        }
        else {
          pcVar12 = &local_1e8[(int)uVar2].m_backend;
          local_1d8.fpclass = cpp_dec_float_finite;
          local_1d8.prec_elem = 0x1c;
          local_1d8.data._M_elems[0] = 0;
          local_1d8.data._M_elems[1] = 0;
          local_1d8.data._M_elems[2] = 0;
          local_1d8.data._M_elems[3] = 0;
          local_1d8.data._M_elems[4] = 0;
          local_1d8.data._M_elems[5] = 0;
          local_1d8.data._M_elems[6] = 0;
          local_1d8.data._M_elems[7] = 0;
          local_1d8.data._M_elems[8] = 0;
          local_1d8.data._M_elems[9] = 0;
          local_1d8.data._M_elems[10] = 0;
          local_1d8.data._M_elems[0xb] = 0;
          local_1d8.data._M_elems[0xc] = 0;
          local_1d8.data._M_elems[0xd] = 0;
          local_1d8.data._M_elems[0xe] = 0;
          local_1d8.data._M_elems[0xf] = 0;
          local_1d8.data._M_elems[0x10] = 0;
          local_1d8.data._M_elems[0x11] = 0;
          local_1d8.data._M_elems[0x12] = 0;
          local_1d8.data._M_elems[0x13] = 0;
          local_1d8.data._M_elems[0x14] = 0;
          local_1d8.data._M_elems[0x15] = 0;
          local_1d8.data._M_elems[0x16] = 0;
          local_1d8.data._M_elems[0x17] = 0;
          local_1d8.data._M_elems[0x18] = 0;
          local_1d8.data._M_elems[0x19] = 0;
          local_1d8.data._M_elems._104_5_ = 0;
          local_1d8.data._M_elems[0x1b]._1_3_ = 0;
          local_1d8.exp = 0;
          local_1d8.neg = false;
          if (&local_1d8 == &pnVar4[(int)uVar2].m_backend) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_1d8,pcVar12);
            if (local_1d8.data._M_elems[0] != 0 || local_1d8.fpclass != cpp_dec_float_finite) {
              local_1d8.neg = (bool)(local_1d8.neg ^ 1);
            }
          }
          else {
            if (&local_1d8 != pcVar12) {
              pcVar11 = pcVar12;
              pcVar14 = &local_1d8;
              for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
                (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
                pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar20 * -8 + 4)
                ;
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar20 * -8 + 4)
                ;
              }
              local_1d8.exp = pcVar12->exp;
              local_1d8.neg = pcVar12->neg;
              local_1d8.fpclass = pcVar12->fpclass;
              local_1d8.prec_elem = pcVar12->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_1d8,&pnVar4[(int)uVar2].m_backend);
          }
          local_288.fpclass = cpp_dec_float_finite;
          local_288.prec_elem = 0x1c;
          local_288.data._M_elems[0] = 0;
          local_288.data._M_elems[1] = 0;
          local_288.data._M_elems[2] = 0;
          local_288.data._M_elems[3] = 0;
          local_288.data._M_elems[4] = 0;
          local_288.data._M_elems[5] = 0;
          local_288.data._M_elems[6] = 0;
          local_288.data._M_elems[7] = 0;
          local_288.data._M_elems[8] = 0;
          local_288.data._M_elems[9] = 0;
          local_288.data._M_elems[10] = 0;
          local_288.data._M_elems[0xb] = 0;
          local_288.data._M_elems[0xc] = 0;
          local_288.data._M_elems[0xd] = 0;
          local_288.data._M_elems[0xe] = 0;
          local_288.data._M_elems[0xf] = 0;
          local_288.data._M_elems[0x10] = 0;
          local_288.data._M_elems[0x11] = 0;
          local_288.data._M_elems[0x12] = 0;
          local_288.data._M_elems[0x13] = 0;
          local_288.data._M_elems[0x14] = 0;
          local_288.data._M_elems[0x15] = 0;
          local_288.data._M_elems[0x16] = 0;
          local_288.data._M_elems[0x17] = 0;
          local_288.data._M_elems[0x18] = 0;
          local_288.data._M_elems[0x19] = 0;
          local_288.data._M_elems._104_5_ = 0;
          local_288.data._M_elems[0x1b]._1_3_ = 0;
          local_288.exp = 0;
          local_288.neg = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_288,&local_1d8,&local_b8);
          pcVar12 = &local_288;
          pcVar11 = &local_138;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pcVar11->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar20 * -8 + 4);
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar20 * -8 + 4);
          }
          local_138.exp = local_288.exp;
          local_138.neg = local_288.neg;
          local_138.fpclass = local_288.fpclass;
          local_138.prec_elem = local_288.prec_elem;
          if (((local_288.fpclass == cpp_dec_float_NaN) ||
              ((max->m_backend).fpclass == cpp_dec_float_NaN)) ||
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&local_138,&max->m_backend), 0 < iVar8)) {
LAB_005ca6bb:
            pcVar12 = local_1f0;
            if (((local_138.fpclass != cpp_dec_float_NaN) &&
                (local_1f0->fpclass != cpp_dec_float_NaN)) &&
               (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&local_138,local_1f0), 0 < iVar8)) {
              pcVar11 = &local_138;
              pcVar14 = pcVar12;
              for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
                (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
                pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar20 * -8 + 4)
                ;
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar20 * -8 + 4)
                ;
              }
              pcVar12->exp = local_138.exp;
              pcVar12->neg = local_138.neg;
              pcVar12->fpclass = local_138.fpclass;
              pcVar12->prec_elem = local_138.prec_elem;
              local_2b0 = uVar2;
            }
          }
          else {
            pcVar12 = &local_138;
            pnVar10 = local_200;
            for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pnVar10->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar20 * -8 + 4);
              pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar10 + ((ulong)bVar20 * -2 + 1) * 4);
            }
            (local_200->m_backend).exp = local_138.exp;
            (local_200->m_backend).neg = local_138.neg;
            (local_200->m_backend).fpclass = local_138.fpclass;
            (local_200->m_backend).prec_elem = local_138.prec_elem;
            pcVar12 = &local_b8;
            pnVar10 = stab;
            for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pnVar10->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar20 * -8 + 4);
              pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar10 + ((ulong)bVar20 * -2 + 1) * 4);
            }
            (stab->m_backend).exp = local_b8.exp;
            (stab->m_backend).neg = local_b8.neg;
            (stab->m_backend).fpclass = local_b8.fpclass;
            (stab->m_backend).prec_elem = local_b8.prec_elem;
            local_2b4 = uVar2;
          }
        }
      }
LAB_005ca7b1:
      puVar18 = (uint *)((long)puVar18 + local_148);
    } while (puVar18 < local_140);
  }
  if ((int)local_2b0 < 1 || -1 < (int)local_2b4) {
    return local_2b4;
  }
  uVar19 = (ulong)local_2b0;
  if (pnVar17[uVar19].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_005ca8bd:
    pcVar11 = &pnVar4[uVar19].m_backend;
    pcVar12 = &local_1f8[uVar19].m_backend;
    local_288.fpclass = cpp_dec_float_finite;
    local_288.prec_elem = 0x1c;
    local_288.data._M_elems[0] = 0;
    local_288.data._M_elems[1] = 0;
    local_288.data._M_elems[2] = 0;
    local_288.data._M_elems[3] = 0;
    local_288.data._M_elems[4] = 0;
    local_288.data._M_elems[5] = 0;
    local_288.data._M_elems[6] = 0;
    local_288.data._M_elems[7] = 0;
    local_288.data._M_elems[8] = 0;
    local_288.data._M_elems[9] = 0;
    local_288.data._M_elems[10] = 0;
    local_288.data._M_elems[0xb] = 0;
    local_288.data._M_elems[0xc] = 0;
    local_288.data._M_elems[0xd] = 0;
    local_288.data._M_elems[0xe] = 0;
    local_288.data._M_elems[0xf] = 0;
    local_288.data._M_elems[0x10] = 0;
    local_288.data._M_elems[0x11] = 0;
    local_288.data._M_elems[0x12] = 0;
    local_288.data._M_elems[0x13] = 0;
    local_288.data._M_elems[0x14] = 0;
    local_288.data._M_elems[0x15] = 0;
    local_288.data._M_elems[0x16] = 0;
    local_288.data._M_elems[0x17] = 0;
    local_288.data._M_elems[0x18] = 0;
    local_288.data._M_elems[0x19] = 0;
    local_288.data._M_elems._104_5_ = 0;
    local_288.data._M_elems[0x1b]._1_3_ = 0;
    local_288.exp = 0;
    local_288.neg = false;
    if (&local_288 == pcVar12) {
LAB_005ca95e:
      local_288.fpclass = cpp_dec_float_finite;
      local_288.prec_elem = 0x1c;
      local_288.neg = false;
      local_288.exp = 0;
      local_288.data._M_elems[0x1b]._1_3_ = 0;
      local_288.data._M_elems._104_5_ = 0;
      local_288.data._M_elems[0x18] = 0;
      local_288.data._M_elems[0x19] = 0;
      local_288.data._M_elems[0x16] = 0;
      local_288.data._M_elems[0x17] = 0;
      local_288.data._M_elems[0x14] = 0;
      local_288.data._M_elems[0x15] = 0;
      local_288.data._M_elems[0x12] = 0;
      local_288.data._M_elems[0x13] = 0;
      local_288.data._M_elems[0x10] = 0;
      local_288.data._M_elems[0x11] = 0;
      local_288.data._M_elems[0xe] = 0;
      local_288.data._M_elems[0xf] = 0;
      local_288.data._M_elems[0xc] = 0;
      local_288.data._M_elems[0xd] = 0;
      local_288.data._M_elems[10] = 0;
      local_288.data._M_elems[0xb] = 0;
      local_288.data._M_elems[8] = 0;
      local_288.data._M_elems[9] = 0;
      local_288.data._M_elems[6] = 0;
      local_288.data._M_elems[7] = 0;
      local_288.data._M_elems[4] = 0;
      local_288.data._M_elems[5] = 0;
      local_288.data._M_elems[2] = 0;
      local_288.data._M_elems[3] = 0;
      local_288.data._M_elems[0] = 0;
      local_288.data._M_elems[1] = 0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&local_288,pcVar11);
      if (local_288.data._M_elems[0] != 0 || local_288.fpclass != cpp_dec_float_finite) {
        local_288.neg = (bool)(local_288.neg ^ 1);
      }
      goto LAB_005ca981;
    }
    if (&local_288 != pcVar11) {
      pcVar14 = pcVar11;
      pcVar16 = &local_288;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar16->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar20 * -8 + 4);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar20 * -8 + 4);
      }
      local_288.exp = pcVar11->exp;
      local_288.neg = pcVar11->neg;
      local_288.fpclass = pcVar11->fpclass;
      local_288.prec_elem = pcVar11->prec_elem;
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&local_288,0,(type *)0x0);
    iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&pnVar17[uVar19].m_backend,&local_288);
    if (iVar8 < 1) goto LAB_005ca8bd;
    pcVar11 = &local_1e8[uVar19].m_backend;
    pcVar12 = &pnVar4[uVar19].m_backend;
    local_288.fpclass = cpp_dec_float_finite;
    local_288.prec_elem = 0x1c;
    local_288.data._M_elems[0] = 0;
    local_288.data._M_elems[1] = 0;
    local_288.data._M_elems[2] = 0;
    local_288.data._M_elems[3] = 0;
    local_288.data._M_elems[4] = 0;
    local_288.data._M_elems[5] = 0;
    local_288.data._M_elems[6] = 0;
    local_288.data._M_elems[7] = 0;
    local_288.data._M_elems[8] = 0;
    local_288.data._M_elems[9] = 0;
    local_288.data._M_elems[10] = 0;
    local_288.data._M_elems[0xb] = 0;
    local_288.data._M_elems[0xc] = 0;
    local_288.data._M_elems[0xd] = 0;
    local_288.data._M_elems[0xe] = 0;
    local_288.data._M_elems[0xf] = 0;
    local_288.data._M_elems[0x10] = 0;
    local_288.data._M_elems[0x11] = 0;
    local_288.data._M_elems[0x12] = 0;
    local_288.data._M_elems[0x13] = 0;
    local_288.data._M_elems[0x14] = 0;
    local_288.data._M_elems[0x15] = 0;
    local_288.data._M_elems[0x16] = 0;
    local_288.data._M_elems[0x17] = 0;
    local_288.data._M_elems[0x18] = 0;
    local_288.data._M_elems[0x19] = 0;
    local_288.data._M_elems._104_5_ = 0;
    local_288.data._M_elems[0x1b]._1_3_ = 0;
    local_288.exp = 0;
    local_288.neg = false;
    if (&local_288 == pcVar12) goto LAB_005ca95e;
    if (&local_288 != pcVar11) {
      pcVar14 = pcVar11;
      pcVar16 = &local_288;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar16->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar20 * -8 + 4);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar20 * -8 + 4);
      }
      local_288.exp = pcVar11->exp;
      local_288.neg = pcVar11->neg;
      local_288.fpclass = pcVar11->fpclass;
      local_288.prec_elem = pcVar11->prec_elem;
    }
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_288,pcVar12);
LAB_005ca981:
  pcVar12 = &local_288;
  pnVar10 = local_208;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pnVar10->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
    pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar20 * -2 + 1) * 4);
    pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar10 + ((ulong)bVar20 * -2 + 1) * 4);
  }
  (local_208->m_backend).exp = local_288.exp;
  (local_208->m_backend).neg = local_288.neg;
  (local_208->m_backend).fpclass = local_288.fpclass;
  (local_208->m_backend).prec_elem = local_288.prec_elem;
  return local_2b4;
}

Assistant:

int SPxFastRT<R>::maxSelect(
   R& val,
   R& stab,
   R& best,
   R& bestDelta,
   R max,
   const UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i;
   R x, y;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();
   const int* last = idx + update.delta().size();

   int nr = -1;
   int bestNr = -1;

   for(idx += start; idx < last; idx += incr)
   {
      i = *idx;
      x = upd[i];

      // in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables
      if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                     && this->thesolver->isBasic(i))))
         continue;

      if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
            && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
            == SPxBasisBase<R>::Desc::P_FIXED)
         continue;

      if(x > stab)
      {
         y = (up[i] - vec[i]) / x;

         if(y <= max)
         {
            val = y;
            nr = i;
            stab = x;
         }
         else if(y > best)
         {
            best = y;
            bestNr = i;
         }
      }
      else if(x < -stab)
      {
         y = (low[i] - vec[i]) / x;

         if(y <= max)
         {
            val = y;
            nr = i;
            stab = -x;
         }
         else if(y > best)
         {
            best = y;
            bestNr = i;
         }
      }
   }

   if(nr < 0 && bestNr > 0)
   {
      if(upd[bestNr] > 0)
         bestDelta = up[bestNr] - vec[bestNr];
      else
         bestDelta = vec[bestNr] - low[bestNr];
   }

   return nr;
}